

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blitter.cpp
# Opt level: O0

bool __thiscall Amiga::Blitter<true>::advance_dma<true>(Blitter<true> *this)

{
  value_type_conflict5 vVar1;
  uint32_t uVar2;
  uint16_t *puVar3;
  uint16_t uVar4;
  unsigned_short uVar5;
  reference pvVar6;
  Channel local_ac;
  Channel local_a8;
  Type local_78 [2];
  uint local_70;
  int local_6c;
  int total_index;
  int c;
  int type_mask;
  int ongoing_carry;
  uint16_t fill_output;
  uint16_t output_1;
  uint16_t b;
  uint16_t a;
  Type local_50 [3];
  pair<Amiga::BlitterSequencer::Channel,_int> local_44;
  pair<Amiga::BlitterSequencer::Channel,_int> next;
  int step;
  int DOWN;
  int UP;
  int RIGHT;
  int LEFT;
  Type local_20;
  uint16_t output;
  Blitter<true> *pBStack_18;
  bool did_output;
  Blitter<true> *this_local;
  
  if (this->height_ == 0) {
    this_local._7_1_ = false;
  }
  else {
    pBStack_18 = this;
    if ((*(int *)&(this->super_DMADevice<4UL,_4UL>).field_0x44 == 8) && (this->height_ == 0x20)) {
      printf("Accelerating %d x %d\n",(ulong)*(uint *)&(this->super_DMADevice<4UL,_4UL>).field_0x44,
             (ulong)(uint)this->height_);
      while (uVar4 = get_status(this), (uVar4 & 0x4000) != 0) {
        advance_dma<false>(this);
      }
      this_local._7_1_ = true;
    }
    else if ((this->line_mode_ & 1U) == 0) {
      if ((this->busy_ & 1U) == 0) {
        BlitterSequencer::begin(&this->sequencer_);
        this->a32_ = 0;
        this->b32_ = 0;
        this->y_ = 0;
        this->x_ = 0;
        this->loop_index_ = -1;
        this->write_phase_ = Starting;
        this->not_zero_flag_ = false;
        this->busy_ = true;
      }
      local_44 = BlitterSequencer::next(&this->sequencer_);
      if (local_44.second != this->loop_index_) {
        if (this->x_ == 0) {
          uVar4 = this->a_mask_[0];
        }
        else {
          uVar4 = 0xffff;
        }
        this->transient_a_mask_ = uVar4;
        if ((this->x_ == 0) && (this->y_ != 0)) {
          add_modulos(this);
        }
        this->x_ = this->x_ + 1;
        if (this->x_ == *(int *)&(this->super_DMADevice<4UL,_4UL>).field_0x44) {
          this->transient_a_mask_ = this->transient_a_mask_ & this->a_mask_[1];
          this->x_ = 0;
          this->y_ = this->y_ + 1;
          if (this->y_ == this->height_) {
            BlitterSequencer::complete(&this->sequencer_);
          }
        }
        this->loop_index_ = this->loop_index_ + 1;
      }
      switch((ulong)local_44 & 0xffffffff) {
      case 0:
      default:
        this->a32_ = this->a32_ << 0x10 | (uint)(this->a_data_ & this->transient_a_mask_);
        this->b32_ = this->b32_ << 0x10 | (uint)this->b_data_;
        if ((this->one_dot_ & 1U) == 0) {
          ongoing_carry._2_2_ = (unsigned_short)(this->a32_ >> ((byte)this->shifts_[0] & 0x1f));
          ongoing_carry._0_2_ = (unsigned_short)(this->b32_ >> ((byte)this->shifts_[1] & 0x1f));
        }
        else {
          ongoing_carry._2_2_ =
               (ushort)(this->a32_ << ((byte)this->shifts_[0] & 0x1f)) |
               (ushort)(this->a32_ >> (0x20U - (char)this->shifts_[0] & 0x1f));
          ongoing_carry._0_2_ =
               (ushort)(this->b32_ << ((byte)this->shifts_[1] & 0x1f)) |
               (ushort)(this->b32_ >> (0x20U - (char)this->shifts_[1] & 0x1f));
        }
        type_mask._2_2_ =
             apply_minterm<unsigned_short>
                       (ongoing_carry._2_2_,(unsigned_short)ongoing_carry,this->c_data_,
                        (uint)this->minterms_);
        if (((this->exclusive_fill_ & 1U) != 0) || ((this->inclusive_fill_ & 1U) != 0)) {
          type_mask._0_2_ = 0;
          c = (int)(this->fill_carry_ & 1);
          total_index = 0;
          if ((this->exclusive_fill_ & 1U) != 0) {
            total_index = 0x20;
          }
          for (local_6c = 0; local_6c < 0x10; local_6c = local_6c + 4) {
            local_70 = type_mask._2_2_ & 0xf | c << 4 | total_index;
            type_mask._0_2_ =
                 (ushort)type_mask |
                 (ushort)((*(uint *)((anonymous_namespace)::fill_values +
                                    (long)((int)local_70 >> 3) * 4) >>
                           (sbyte)((type_mask._2_2_ & 7) << 2) & 0xf) << ((byte)local_6c & 0x1f));
            c = *(uint *)((long)&(anonymous_namespace)::fill_carries +
                         (long)((int)local_70 >> 5) * 4) >> ((byte)local_70 & 0x1f) & 1;
            type_mask._2_2_ = (unsigned_short)((int)(uint)type_mask._2_2_ >> 4);
          }
          type_mask._2_2_ = (ushort)type_mask;
          this->fill_carry_ = c != 0;
        }
        this->not_zero_flag_ = (this->not_zero_flag_ & 1U) != 0 || type_mask._2_2_ != 0;
        if (this->write_phase_ != Starting) {
          if (this->write_phase_ != Full) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Blitter.cpp"
                          ,0x22f,
                          "bool Amiga::Blitter<true>::advance_dma() [record_bus = true, complete_immediately = true]"
                         );
          }
          local_78[1] = 5;
          std::
          vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
          ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                    ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                      *)&this->transactions_,local_78 + 1,&this->write_address_,&this->write_value_)
          ;
          (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_
          [this->write_address_ & (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_] =
               this->write_value_;
        }
        this->write_phase_ = Full;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,3);
        this->write_address_ = *pvVar6;
        this->write_value_ = type_mask._2_2_;
        local_78[0] = AddToPipeline;
        std::
        vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
        ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                  ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                    *)&this->transactions_,local_78,&this->write_address_,&this->write_value_);
        uVar2 = this->direction_;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,3);
        *pvVar6 = uVar2 + *pvVar6;
        this_local._7_1_ = true;
        break;
      case 1:
        add_modulos(this);
        DMADeviceBase::posit_interrupt((DMADeviceBase *)this,0x40);
        this->height_ = 0;
        this->busy_ = false;
        if (this->write_phase_ == Full) {
          _b = WriteFromPipeline;
          std::
          vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
          ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                    ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                      *)&this->transactions_,(Type *)&b,&this->write_address_,&this->write_value_);
          (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_
          [this->write_address_ & (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_] =
               this->write_value_;
          this->write_phase_ = Starting;
        }
        this_local._7_1_ = true;
        break;
      case 2:
        puVar3 = (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,2);
        this->c_data_ =
             puVar3[*pvVar6 & (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_];
        local_50[0] = ReadC;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,2);
        std::
        vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
        ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                  ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                    *)&this->transactions_,local_50,pvVar6,&this->c_data_);
        uVar2 = this->direction_;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,2);
        *pvVar6 = uVar2 + *pvVar6;
        this_local._7_1_ = true;
        break;
      case 3:
        puVar3 = (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,1);
        this->b_data_ =
             puVar3[*pvVar6 & (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_];
        local_50[1] = 2;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,1);
        std::
        vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
        ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                  ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                    *)&this->transactions_,local_50 + 1,pvVar6,&this->b_data_);
        uVar2 = this->direction_;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,1);
        *pvVar6 = uVar2 + *pvVar6;
        this_local._7_1_ = true;
        break;
      case 4:
        puVar3 = (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,0);
        this->a_data_ =
             puVar3[*pvVar6 & (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_];
        local_50[2] = 1;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,0);
        std::
        vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
        ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                  ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                    *)&this->transactions_,local_50 + 2,pvVar6,&this->a_data_);
        uVar2 = this->direction_;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,0);
        *pvVar6 = uVar2 + *pvVar6;
        this_local._7_1_ = true;
        break;
      case 5:
        _fill_output = SkippedSlot;
        std::
        vector<Amiga::Blitter<true>::Transaction,_std::allocator<Amiga::Blitter<true>::Transaction>_>
        ::emplace_back<Amiga::Blitter<true>::Transaction::Type>
                  (&this->transactions_,(Type *)&fill_output);
        this_local._7_1_ = false;
      }
    }
    else {
      this->not_zero_flag_ = false;
      if (this->b_data_ != 0xffff) {
        __assert_fail("b_data_ == 0xffff",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Blitter.cpp"
                      ,0x109,
                      "bool Amiga::Blitter<true>::advance_dma() [record_bus = true, complete_immediately = true]"
                     );
      }
      if ((this->busy_ & 1U) == 0) {
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,0);
        this->error_ = (int)(short)(*pvVar6 << 1) >> 1;
        this->draw_ = true;
        this->busy_ = true;
        this->has_c_data_ = false;
      }
      output._1_1_ = 0;
      if ((this->draw_ & 1U) != 0) {
        if ((this->has_c_data_ & 1U) == 0) {
          this->has_c_data_ = true;
          puVar3 = (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_;
          pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                             ((array<unsigned_int,_4UL> *)
                              &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,3);
          this->c_data_ =
               puVar3[*pvVar6 & (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_];
          local_20 = ReadC;
          pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                             ((array<unsigned_int,_4UL> *)
                              &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,3);
          std::
          vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
          ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                    ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                      *)&this->transactions_,&local_20,pvVar6,&this->c_data_);
          return true;
        }
        uVar5 = apply_minterm<unsigned_short>
                          ((unsigned_short)
                           ((int)(uint)this->a_data_ >> ((byte)this->shifts_[0] & 0x1f)),
                           this->b_data_,this->c_data_,(uint)this->minterms_);
        puVar3 = (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_;
        LEFT._2_2_ = uVar5;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,3);
        puVar3[*pvVar6 & (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_] = uVar5;
        this->not_zero_flag_ = (this->not_zero_flag_ & 1U) != 0 || LEFT._2_2_ != 0;
        this->draw_ = (this->draw_ & 1U & (this->one_dot_ ^ 0xffU) & 1) != 0;
        this->has_c_data_ = false;
        output._1_1_ = 1;
        RIGHT = 5;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,3);
        std::
        vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
        ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short_const&>
                  ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                    *)&this->transactions_,(Type *)&RIGHT,pvVar6,(unsigned_short *)((long)&LEFT + 2)
                  );
      }
      next.second = 8;
      if ((this->line_direction_ & 4U) == 0) {
        local_a8 = 8;
        if ((this->line_direction_ & 1U) != 0) {
          local_a8 = A;
        }
      }
      else {
        local_a8 = C;
        if ((this->line_direction_ & 1U) != 0) {
          local_a8 = FlushPipeline;
        }
      }
      next.first = local_a8;
      if (this->error_ < 0) {
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           (&(this->super_DMADevice<4UL,_4UL>).modulos_,1);
        this->error_ = *pvVar6 + this->error_;
      }
      else {
        if ((this->line_direction_ & 4U) == 0) {
          local_ac = C;
          if ((this->line_direction_ & 2U) != 0) {
            local_ac = FlushPipeline;
          }
        }
        else {
          local_ac = 8;
          if ((this->line_direction_ & 2U) != 0) {
            local_ac = A;
          }
        }
        next.first = local_ac | local_a8;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           (&(this->super_DMADevice<4UL,_4UL>).modulos_,0);
        this->error_ = *pvVar6 + this->error_;
      }
      if ((next.first & FlushPipeline) == Write) {
        if (((next.first & C) != Write) &&
           (this->shifts_[0] = this->shifts_[0] + 1, this->shifts_[0] == 0x10)) {
          pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                             ((array<unsigned_int,_4UL> *)
                              &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,3);
          *pvVar6 = *pvVar6 + 1;
        }
      }
      else {
        this->shifts_[0] = this->shifts_[0] + -1;
        if (this->shifts_[0] == -1) {
          pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                             ((array<unsigned_int,_4UL> *)
                              &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,3);
          *pvVar6 = *pvVar6 - 1;
        }
      }
      this->shifts_[0] = this->shifts_[0] & 0xf;
      if ((next.first & A) == Write) {
        if ((next.first & 8) != Write) {
          pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                             (&(this->super_DMADevice<4UL,_4UL>).modulos_,2);
          vVar1 = *pvVar6;
          pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                             ((array<unsigned_int,_4UL> *)
                              &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,3);
          *pvVar6 = vVar1 + *pvVar6;
          this->draw_ = true;
        }
      }
      else {
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           (&(this->super_DMADevice<4UL,_4UL>).modulos_,2);
        vVar1 = *pvVar6;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,3);
        *pvVar6 = *pvVar6 - vVar1;
        this->draw_ = true;
      }
      this->height_ = this->height_ + -1;
      if (this->height_ == 0) {
        this->busy_ = false;
        DMADeviceBase::posit_interrupt((DMADeviceBase *)this,0x40);
      }
      this_local._7_1_ = (bool)(output._1_1_ & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Blitter<record_bus>::advance_dma() {
	if(!height_) return false;

	// TODO: eliminate @c complete_immediately and this workaround.
	// See commentary in Chipset.cpp.
	if constexpr (complete_immediately) {

		// HACK! HACK!! HACK!!!
		//
		// This resolves an issue with loading the particular copy of Spindizzy Worlds
		// I am testing against.
		//
		// TODO: DO NOT PUBLISH THIS.
		//
		// This is committed solely so that I can continue researching the real, underlying
		// issue across machines. It would not be acceptable to me to ship this.
		// (and the printf is another reminder-to-self)
		if(width_ == 8 && height_ == 32) {
			printf("Accelerating %d x %d\n", width_, height_);

			while(get_status() & 0x4000) {
				advance_dma<false>();
			}
			return true;
		}
	}

	if(line_mode_) {
		not_zero_flag_ = false;

		// As-yet unimplemented:
		assert(b_data_ == 0xffff);

		//
		// Line mode.
		//

		// Bluffer's guide to line mode:
		//
		// In Bresenham terms, the following registers have been set up:
		//
		//	[A modulo] = 4 * (dy - dx)
		//	[B modulo] = 4 * dy
		//	[A pointer] = 4 * dy - 2 * dx, with the sign flag in BLTCON1 indicating sign.
		//
		//	[A data] = 0x8000
		//	[Both masks] = 0xffff
		//	[A shift] = x1 & 15
		//
		//	[B data] = texture
		//	[B shift] = bit at which to start the line texture (0 = LSB)
		//
		//	[C and D pointers] = word containing the first pixel of the line
		//	[C and D modulo] = width of the bitplane in bytes
		//
		//	height = number of pixels
		//
		//	If ONEDOT of BLTCON1 is set, plot only a single bit per horizontal row.
		//
		//	BLTCON1 quadrants are (bits 2–4):
		//
		//		110 -> step in x, x positive, y negative
		//		111 -> step in x, x negative, y negative
		//		101 -> step in x, x negative, y positive
		//		100 -> step in x, x positive, y positive
		//
		//		001 -> step in y, x positive, y negative
		//		011 -> step in y, x negative, y negative
		//		010 -> step in y, x negative, y positive
		//		000 -> step in y, x positive, y positive
		//
		//	So that's:
		//
		//		* bit 4 = x [=1] or y [=0] major;
		//		* bit 3 = 1 => major variable negative; otherwise positive;
		//		* bit 2 = 1 => minor variable negative; otherwise positive.

		//
		// Implementation below is heavily based on the documentation found
		// at https://github.com/niklasekstrom/blitter-subpixel-line/blob/master/Drawing%20lines%20using%20the%20Amiga%20blitter.pdf
		//

		//
		// Caveat: I've no idea how the DMA access slots should be laid out for
		// line drawing.
		//

		if(!busy_) {
			error_ = int16_t(pointer_[0] << 1) >> 1;	// TODO: what happens if line_sign_ doesn't agree with this?
			draw_ = true;
			busy_ = true;
			has_c_data_ = false;
		}

		bool did_output = false;
		if(draw_) {
			// TODO: patterned lines. Unclear what to do with the bit that comes out of b.
			// Probably extend it to a full word?

			if(!has_c_data_) {
				has_c_data_ = true;
				c_data_ = ram_[pointer_[3] & ram_mask_];
				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::ReadC, pointer_[3], c_data_);
				}
				return true;
			}

			const uint16_t output =
				apply_minterm<uint16_t>(a_data_ >> shifts_[0], b_data_, c_data_, minterms_);
			ram_[pointer_[3] & ram_mask_] = output;
			not_zero_flag_ |= output;
			draw_ &= !one_dot_;
			has_c_data_ = false;
			did_output = true;
			if constexpr (record_bus) {
				transactions_.emplace_back(Transaction::Type::WriteFromPipeline, pointer_[3], output);
			}
		}

		constexpr int LEFT	= 1 << 0;
		constexpr int RIGHT	= 1 << 1;
		constexpr int UP	= 1 << 2;
		constexpr int DOWN	= 1 << 3;
		int step = (line_direction_ & 4) ?
			((line_direction_ & 1) ? LEFT : RIGHT) :
			((line_direction_ & 1) ? UP : DOWN);

		if(error_ < 0) {
			error_ += modulos_[1];
		} else {
			step |=
				(line_direction_ & 4) ?
					((line_direction_ & 2) ? UP : DOWN) :
					((line_direction_ & 2) ? LEFT : RIGHT);

			error_ += modulos_[0];
		}

		if(step & LEFT) {
			--shifts_[0];
			if(shifts_[0] == -1) {
				--pointer_[3];
			}
		} else if(step & RIGHT) {
			++shifts_[0];
			if(shifts_[0] == 16) {
				++pointer_[3];
			}
		}
		shifts_[0] &= 15;

		if(step & UP) {
			pointer_[3] -= modulos_[2];
			draw_ = true;
		} else if(step & DOWN) {
			pointer_[3] += modulos_[2];
			draw_ = true;
		}

		--height_;
		if(!height_) {
			busy_ = false;
			posit_interrupt(InterruptFlag::Blitter);
		}

		return did_output;
	} else {
		// Copy mode.
		if(!busy_) {
			sequencer_.begin();
			a32_ = 0;
			b32_ = 0;

			y_ = 0;
			x_ = 0;
			loop_index_ = -1;
			write_phase_ = WritePhase::Starting;
			not_zero_flag_ = false;
			busy_ = true;
		}

		const auto next = sequencer_.next();

		// If this is the start of a new iteration, check for end of line,
		// or of blit, and pick an appropriate mask for A based on location.
		if(next.second != loop_index_) {
			transient_a_mask_ = x_ ? 0xffff : a_mask_[0];

			// Check whether an entire row was completed in the previous iteration.
			// If so then add modulos. Though this won't capture the move off the
			// final line, so that's handled elsewhere.
			if(!x_ && y_) {
				add_modulos();
			}

			++x_;
			if(x_ == width_) {
				transient_a_mask_ &= a_mask_[1];
				x_ = 0;
				++y_;
				if(y_ == height_) {
					sequencer_.complete();
				}
			}
			++loop_index_;
		}

		using Channel = BlitterSequencer::Channel;
		switch(next.first) {
			case Channel::A:
				a_data_ = ram_[pointer_[0] & ram_mask_];

				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::ReadA, pointer_[0], a_data_);
				}
				pointer_[0] += direction_;
			return true;
			case Channel::B:
				b_data_ = ram_[pointer_[1] & ram_mask_];

				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::ReadB, pointer_[1], b_data_);
				}
				pointer_[1] += direction_;
			return true;
			case Channel::C:
				c_data_ = ram_[pointer_[2] & ram_mask_];

				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::ReadC, pointer_[2], c_data_);
				}
				pointer_[2] += direction_;
			return true;
			case Channel::FlushPipeline:
				add_modulos();
				posit_interrupt(InterruptFlag::Blitter);
				height_ = 0;
				busy_ = false;

				if(write_phase_ == WritePhase::Full) {
					if constexpr (record_bus) {
						transactions_.emplace_back(Transaction::Type::WriteFromPipeline, write_address_, write_value_);
					}
					ram_[write_address_ & ram_mask_] = write_value_;
					write_phase_ = WritePhase::Starting;
				}
			return true;

			case Channel::None:
				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::SkippedSlot);
				}
			return false;

			case Channel::Write:	break;
		}

		a32_ = (a32_ << 16) | (a_data_ & transient_a_mask_);
		b32_ = (b32_ << 16) | b_data_;

		uint16_t a, b;

		// The barrel shifter shifts to the right in ascending address mode,
		// but to the left otherwise.
		if(!one_dot_) {
			a = uint16_t(a32_ >> shifts_[0]);
			b = uint16_t(b32_ >> shifts_[1]);
		} else {
			// TODO: there must be a neater solution than this.
			a = uint16_t(
				(a32_ << shifts_[0]) |
				(a32_ >> (32 - shifts_[0]))
			);

			b = uint16_t(
				(b32_ << shifts_[1]) |
				(b32_ >> (32 - shifts_[1]))
			);
		}

		uint16_t output =
			apply_minterm<uint16_t>(
				a,
				b,
				c_data_,
				minterms_);

		if(exclusive_fill_ || inclusive_fill_) {
			// Use the fill tables nibble-by-nibble to figure out the filled word.
			uint16_t fill_output = 0;
			int ongoing_carry = fill_carry_;
			const int type_mask = exclusive_fill_ ? (1 << 5) : 0;
			for(int c = 0; c < 16; c += 4) {
				const int total_index = (output & 0xf) | (ongoing_carry << 4) | type_mask;
				fill_output |= ((fill_values[total_index >> 3] >> ((total_index & 7) * 4)) & 0xf) << c;
				ongoing_carry = (fill_carries[total_index >> 5] >> (total_index & 31)) & 1;
				output >>= 4;
			}

			output = fill_output;
			fill_carry_ = ongoing_carry;
		}

		not_zero_flag_ |= output;

		switch(write_phase_) {
			case WritePhase::Full:
				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::WriteFromPipeline, write_address_, write_value_);
				}
				ram_[write_address_ & ram_mask_] = write_value_;
				[[fallthrough]];

			case WritePhase::Starting:
				write_phase_ = WritePhase::Full;
				write_address_ = pointer_[3];
				write_value_ = output;

				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::AddToPipeline, write_address_, write_value_);
				}
				pointer_[3] += direction_;
			return true;

			default: assert(false);
		}
	}

	return true;
}